

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O2

void __thiscall Assimp::Collada::Node::Node(Node *this)

{
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  (this->mName)._M_string_length = 0;
  (this->mName).field_2._M_local_buf[0] = '\0';
  (this->mID)._M_dataplus._M_p = (pointer)&(this->mID).field_2;
  (this->mID)._M_string_length = 0;
  (this->mID).field_2._M_local_buf[0] = '\0';
  (this->mSID)._M_dataplus._M_p = (pointer)&(this->mSID).field_2;
  (this->mSID)._M_string_length = 0;
  (this->mSID).field_2._M_local_buf[0] = '\0';
  memset(&this->mParent,0,0x98);
  (this->mPrimaryCamera)._M_dataplus._M_p = (pointer)&(this->mPrimaryCamera).field_2;
  (this->mPrimaryCamera)._M_string_length = 0;
  (this->mPrimaryCamera).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Node()
    : mParent( nullptr ){
        // empty
    }